

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_subject_set_by_edition_removes_all_older_edition_subject_sets_Test::TestBody
          (SubjectSetRegisterTest_subject_set_by_edition_removes_all_older_edition_subject_sets_Test
           *this)

{
  char *pcVar1;
  char *in_R9;
  AssertHelper AStack_298;
  AssertHelper local_290;
  _Storage<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>,_false>
  local_288;
  byte local_270;
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  subject_set3;
  SubjectSetRegister subject_register;
  _Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> local_160;
  _Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> local_f0;
  _Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> local_80;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(&subject_register);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_228,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_228,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset(&local_80)
  ;
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_240,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_240,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset(&local_f0)
  ;
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_258,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_258,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            (&local_160);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((uint)&subject_set3);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((uint)&local_288);
  gtest_ar_.success_ = (bool)(local_270 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::
  _Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
              *)&local_288._M_value);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&AStack_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_288._M_value,(internal *)&gtest_ar_,(AssertionResult *)0x1fec33,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x15b,(char *)local_288._M_value.
                              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&AStack_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    std::__cxx11::string::~string((string *)&local_288._M_value);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_298);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((uint)&local_288);
  gtest_ar_.success_ = (bool)(local_270 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::
  _Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
              *)&local_288._M_value);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&AStack_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_288._M_value,(internal *)&gtest_ar_,(AssertionResult *)0x1fec5c,
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x15c,(char *)local_288._M_value.
                              super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&AStack_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    std::__cxx11::string::~string((string *)&local_288._M_value);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_298);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((uint)&local_288);
  testing::internal::
  CmpHelperEQ<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((internal *)&gtest_ar_,"*subject_set3","*subject_register.SubjectSetByEdition(3)",
             (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              *)&subject_set3,&local_288._M_value);
  std::
  _Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
              *)&local_288._M_value);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_288._M_value);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x15d,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_298,(Message *)&local_288._M_value);
    testing::internal::AssertHelper::~AssertHelper(&AStack_298);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_288._M_value);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition((uint)&local_288);
  testing::internal::
  CmpHelperEQ<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((internal *)&gtest_ar_,"*subject_set3","*subject_register.SubjectSetByEdition(3)",
             (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              *)&subject_set3,&local_288._M_value);
  std::
  _Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
              *)&local_288._M_value);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_288._M_value);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x15e,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_298,(Message *)&local_288._M_value);
    testing::internal::AssertHelper::~AssertHelper(&AStack_298);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_288._M_value);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::
  _Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
              *)&subject_set3);
  SubjectSetRegister::~SubjectSetRegister(&subject_register);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, subject_set_by_edition_removes_all_older_edition_subject_sets)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.NextSubscriptionSync();
    subject_register.Register(SS_SUBJECT1, false);
    subject_register.NextSubscriptionSync();
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.NextSubscriptionSync();

    auto subject_set3 = subject_register.SubjectSetByEdition(3);
    EXPECT_FALSE(subject_register.SubjectSetByEdition(1));
    EXPECT_FALSE(subject_register.SubjectSetByEdition(2));
    EXPECT_EQ(*subject_set3, *subject_register.SubjectSetByEdition(3));
    EXPECT_EQ(*subject_set3, *subject_register.SubjectSetByEdition(3));
}